

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cpp
# Opt level: O0

void jsonnet::internal::jsonnet_static_analysis(AST *ast)

{
  IdSet *in_stack_00000ad8;
  undefined1 in_stack_00000ae7;
  AST *in_stack_00000ae8;
  
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         *)0x21488c);
  static_analysis(in_stack_00000ae8,(bool)in_stack_00000ae7,in_stack_00000ad8);
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *)0x2148ad);
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *)0x2148b7);
  return;
}

Assistant:

void jsonnet_static_analysis(AST *ast)
{
    static_analysis(ast, false, IdSet{});
}